

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyParserColorStopList.cpp
# Opt level: O0

bool __thiscall
Rml::PropertyParserColorStopList::ParseValue
          (PropertyParserColorStopList *this,Property *property,String *value,
          ParameterMap *parameters)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  PropertyParser *pPVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  undefined8 this_01;
  bool bVar3;
  uint uVar4;
  Units units;
  ulong uVar5;
  size_t sVar6;
  size_type sVar7;
  reference string;
  reference pvVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  float number;
  Units local_228;
  Variant local_1f8;
  NumericValue local_1d0;
  undefined1 local_1c8 [8];
  Property p_position;
  size_t i;
  Colour<unsigned_char,_255,_true> local_168;
  undefined1 local_164 [8];
  ColorStop color_stop;
  Property p_color;
  StringList values;
  String *color_stop_str;
  iterator __end1;
  iterator __begin1;
  StringList *__range1;
  ColorStopList color_stops;
  key_type local_b0;
  Units local_90;
  Unit accepted_units;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_80 [8];
  StringList color_stop_str_list;
  undefined1 local_60 [8];
  ParameterMap empty_parameter_map;
  ParameterMap *parameters_local;
  String *value_local;
  Property *property_local;
  PropertyParserColorStopList *this_local;
  
  empty_parameter_map._40_8_ = parameters;
  robin_hood::detail::
  Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::Table((Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_60);
  uVar5 = ::std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(local_80);
    StringUtilities::ExpandString((StringList *)local_80,value,',','(',')',false);
    bVar3 = ::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(local_80);
    this_01 = empty_parameter_map._40_8_;
    if (bVar3) {
      this_local._7_1_ = 0;
      color_stop_str_list.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    }
    else {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b0,"angle",
                 (allocator<char> *)
                 ((long)&color_stops.
                         super__Vector_base<Rml::ColorStop,_std::allocator<Rml::ColorStop>_>._M_impl
                         .super__Vector_impl_data._M_end_of_storage + 7));
      sVar6 = robin_hood::detail::
              Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count((Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)this_01,&local_b0);
      if (sVar6 == 0) {
        local_228 = LENGTH_PERCENT;
      }
      else {
        local_228 = operator|(ANGLE,PERCENT);
      }
      ::std::__cxx11::string::~string((string *)&local_b0);
      ::std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&color_stops.
                         super__Vector_base<Rml::ColorStop,_std::allocator<Rml::ColorStop>_>._M_impl
                         .super__Vector_impl_data._M_end_of_storage + 7));
      local_90 = local_228;
      ::std::vector<Rml::ColorStop,_std::allocator<Rml::ColorStop>_>::vector
                ((vector<Rml::ColorStop,_std::allocator<Rml::ColorStop>_> *)&__range1);
      sVar7 = ::std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(local_80);
      ::std::vector<Rml::ColorStop,_std::allocator<Rml::ColorStop>_>::reserve
                ((vector<Rml::ColorStop,_std::allocator<Rml::ColorStop>_> *)&__range1,sVar7);
      __end1 = ::std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(local_80);
      color_stop_str =
           (String *)
           ::std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(local_80);
      while (bVar3 = __gnu_cxx::operator!=
                               (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&color_stop_str), bVar3) {
        string = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end1);
        this_00 = &p_color.source.
                   super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount;
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)this_00);
        StringUtilities::ExpandString((StringList *)this_00,string,' ','(',')',true);
        bVar3 = ::std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&p_color.source.
                            super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount);
        if ((bVar3) ||
           (sVar7 = ::std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&p_color.source.
                               super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount), 3 < sVar7)) {
          this_local._7_1_ = 0;
          color_stop_str_list.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
        }
        else {
          Property::Property((Property *)&color_stop.position);
          pPVar1 = this->parser_color;
          pvVar8 = ::std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)&p_color.source.
                                    super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount,0);
          uVar4 = (*pPVar1->_vptr_PropertyParser[2])(pPVar1,&color_stop.position,pvVar8,local_60);
          if ((uVar4 & 1) == 0) {
            this_local._7_1_ = 0;
            color_stop_str_list.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
          }
          else {
            Colour<unsigned_char,_255,_true>::Colour
                      ((Colour<unsigned_char,_255,_true> *)local_164,'\0',0xff);
            NumericValue::NumericValue((NumericValue *)(local_164 + 4));
            i._4_4_ = Property::Get<Rml::Colour<unsigned_char,255,false>>
                                ((Property *)&color_stop.position);
            local_168 = Colour<unsigned_char,255,false>::
                        ToPremultiplied<std::integral_constant<bool,false>,void>
                                  ((Colour<unsigned_char,255,false> *)((long)&i + 4));
            local_164._0_4_ = local_168;
            sVar7 = ::std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&p_color.source.
                               super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount);
            if (sVar7 < 2) {
              ::std::vector<Rml::ColorStop,_std::allocator<Rml::ColorStop>_>::push_back
                        ((vector<Rml::ColorStop,_std::allocator<Rml::ColorStop>_> *)&__range1,
                         (value_type *)local_164);
            }
            for (p_position.source.
                 super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
                _Var2._M_pi = p_position.source.
                              super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount._M_pi,
                p_Var9 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         ::std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)&p_color.source.
                                    super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount), _Var2._M_pi < p_Var9;
                p_position.source.
                super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi =
                     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     ((long)&(p_position.source.
                              super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount._M_pi)->_vptr__Sp_counted_base + 1)) {
              Property::
              Property<Rml::Style::LengthPercentageAuto::Type,Rml::Style::LengthPercentageAuto::Type>
                        ((Property *)local_1c8,Auto);
              pvVar8 = ::std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)&p_color.source.
                                        super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount,
                                    (size_type)
                                    p_position.source.
                                    super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi);
              bVar3 = PropertyParserNumber::ParseValue
                                (&this->parser_length_percent_angle,(Property *)local_1c8,pvVar8,
                                 (ParameterMap *)local_60);
              if (bVar3) {
                units = operator&(p_position.value.data._24_4_,local_90);
                bVar3 = Any(units);
                if (bVar3) {
                  number = Property::Get<float>((Property *)local_1c8);
                  NumericValue::NumericValue(&local_1d0,number,p_position.value.data._24_4_);
                  stack0xfffffffffffffea0 = local_1d0;
                }
                else if (p_position.value.data._24_4_ != 1) {
                  this_local._7_1_ = 0;
                  color_stop_str_list.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
                  goto LAB_005e6e10;
                }
                ::std::vector<Rml::ColorStop,_std::allocator<Rml::ColorStop>_>::push_back
                          ((vector<Rml::ColorStop,_std::allocator<Rml::ColorStop>_> *)&__range1,
                           (value_type *)local_164);
                color_stop_str_list.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
              }
              else {
                this_local._7_1_ = 0;
                color_stop_str_list.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
              }
LAB_005e6e10:
              Property::~Property((Property *)local_1c8);
              if (color_stop_str_list.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ != 0) goto LAB_005e6e45;
            }
            color_stop_str_list.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
          }
LAB_005e6e45:
          Property::~Property((Property *)&color_stop.position);
        }
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&p_color.source.
                      super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
        if (color_stop_str_list.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ != 0) goto LAB_005e6eda;
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end1);
      }
      Variant::Variant<std::vector<Rml::ColorStop,std::allocator<Rml::ColorStop>>,void>
                (&local_1f8,(vector<Rml::ColorStop,_std::allocator<Rml::ColorStop>_> *)&__range1);
      Variant::operator=(&property->value,&local_1f8);
      Variant::~Variant(&local_1f8);
      property->unit = COLORSTOPLIST;
      this_local._7_1_ = 1;
      color_stop_str_list.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
LAB_005e6eda:
      ::std::vector<Rml::ColorStop,_std::allocator<Rml::ColorStop>_>::~vector
                ((vector<Rml::ColorStop,_std::allocator<Rml::ColorStop>_> *)&__range1);
    }
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(local_80);
  }
  else {
    this_local._7_1_ = 0;
    color_stop_str_list.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  }
  robin_hood::detail::
  Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~Table((Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_60);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool PropertyParserColorStopList::ParseValue(Property& property, const String& value, const ParameterMap& parameters) const
{
	const ParameterMap empty_parameter_map;

	if (value.empty())
		return false;

	StringList color_stop_str_list;
	StringUtilities::ExpandString(color_stop_str_list, value, ',', '(', ')');

	if (color_stop_str_list.empty())
		return false;

	const Unit accepted_units = (parameters.count("angle") ? (Unit::ANGLE | Unit::PERCENT) : Unit::LENGTH_PERCENT);

	ColorStopList color_stops;
	color_stops.reserve(color_stop_str_list.size());

	for (const String& color_stop_str : color_stop_str_list)
	{
		StringList values;
		StringUtilities::ExpandString(values, color_stop_str, ' ', '(', ')', true);

		if (values.empty() || values.size() > 3)
			return false;

		Property p_color;
		if (!parser_color->ParseValue(p_color, values[0], empty_parameter_map))
			return false;

		ColorStop color_stop = {};
		color_stop.color = p_color.Get<Colourb>().ToPremultiplied();

		if (values.size() <= 1)
			color_stops.push_back(color_stop);

		for (size_t i = 1; i < values.size(); i++)
		{
			Property p_position(Style::LengthPercentageAuto::Auto);
			if (!parser_length_percent_angle.ParseValue(p_position, values[i], empty_parameter_map))
				return false;

			if (Any(p_position.unit & accepted_units))
				color_stop.position = NumericValue(p_position.Get<float>(), p_position.unit);
			else if (p_position.unit != Unit::KEYWORD)
				return false;

			color_stops.push_back(color_stop);
		}
	}

	property.value = Variant(std::move(color_stops));
	property.unit = Unit::COLORSTOPLIST;

	return true;
}